

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall ccs::CcsDomain::CcsDomain(CcsDomain *this,bool logAccesses)

{
  _Head_base<0UL,_ccs::DagBuilder_*,_false> this_00;
  shared_ptr<ccs::CcsLogger> sStack_38;
  shared_ptr<ccs::CcsTracer> local_28;
  
  this_00._M_head_impl = (DagBuilder *)operator_new(0x28);
  CcsLogger::makeStdErrLogger();
  CcsTracer::makeLoggingTracer((CcsTracer *)&local_28,&sStack_38,logAccesses);
  DagBuilder::DagBuilder(this_00._M_head_impl,&local_28);
  (this->dag)._M_t.super___uniq_ptr_impl<ccs::DagBuilder,_std::default_delete<ccs::DagBuilder>_>.
  _M_t.super__Tuple_impl<0UL,_ccs::DagBuilder_*,_std::default_delete<ccs::DagBuilder>_>.
  super__Head_base<0UL,_ccs::DagBuilder_*,_false>._M_head_impl = this_00._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<ccs::CcsTracer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_38.super___shared_ptr<ccs::CcsLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

CcsDomain::CcsDomain(bool logAccesses) :
  dag(new DagBuilder(CcsTracer::makeLoggingTracer(
    CcsLogger::makeStdErrLogger(), logAccesses))) {}